

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O3

bool DecodeSize(uchar *in,size_t cbIn,size_t *size,size_t *cbRead)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  
  *size = 0;
  *cbRead = 0;
  if (cbIn == 0) {
    return false;
  }
  bVar1 = *in;
  if ((long)(char)bVar1 < 0) {
    bVar1 = bVar1 & 0x7f;
    if ((bVar1 < 9) && (bVar1 != 0 && bVar1 + 1 <= cbIn)) {
      *cbRead = (ulong)(bVar1 + 1);
      sVar2 = 0;
      uVar3 = 1;
      do {
        sVar4 = in[uVar3] + sVar2;
        sVar2 = sVar4 * 0x100;
        if (bVar1 <= uVar3) {
          sVar2 = sVar4;
        }
        bVar5 = uVar3 != bVar1;
        uVar3 = uVar3 + 1;
      } while (bVar5);
      if (-1 < (long)sVar2) {
        *size = sVar2;
        goto LAB_00137066;
      }
    }
    bVar5 = false;
  }
  else {
    *size = (long)(char)bVar1;
    *cbRead = 1;
LAB_00137066:
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool DecodeSize(const unsigned char* in, size_t cbIn, size_t& size, size_t& cbRead)
{
	unsigned int i = 0;

	size = 0;
	cbRead = 0;

	if (cbIn == 0)
	{
		return false;
	}

	// Detect short form
	if ((in[0] & 0x80) == 0)
	{
		size = in[0];
		cbRead = 1;
		return true;
	}

	unsigned int bytesToDecode = static_cast<unsigned char>(in[0] & (~0x80));
	unsigned long long tmp = 0;

	// Decode a maximum of 8 bytes, which adds up to a 56-bit number
	// That's MUCH bigger than anything we could possibly decode
	// And bytes to decode has to be at least one, or it isn't legal
    // Note - the case of 1 happens when you have a length between 128 and 255,
    // so the high bit is set, which precludes short form, resulting in a pattern of 0x81, 0x8b 
    // to encode the value of 139.
	if (bytesToDecode > 8 || bytesToDecode + 1 > cbIn || bytesToDecode == 0)
		return false;

	cbRead = bytesToDecode + 1;

	for (i = 1; i < cbRead; ++i)
	{
		tmp += in[i];

		if (i < bytesToDecode)
			tmp <<= 8;
	}

	// We now have the size in a 64-bit value, check whether it fits in a size_t
	// Arbitrarily say that max size is 1/2 SIZE_T_MAX
	size_t maxSize = (~(static_cast<size_t>(0))) >> 1;

	if (tmp > maxSize)
	{
		return false;
	}

	size = static_cast<size_t>(tmp);
	return true;
}